

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O2

void __thiscall xray_re::xr_visual_object::save(xr_visual_object *this,xr_writer *w)

{
  undefined4 local_20;
  undefined4 local_1c;
  
  xr_custom_object::save(&this->super_xr_custom_object,w);
  xr_writer::w_chunk<unsigned_short>(w,0x900,&SCENEOBJ_VERSION);
  xr_writer::open_chunk(w,0x902);
  local_20 = *(undefined4 *)&(this->super_xr_custom_object).field_0x6c;
  (*w->_vptr_xr_writer[2])(w,&local_20,4);
  local_1c = 0;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::w_sz(w,&this->m_reference);
  xr_writer::close_chunk(w);
  xr_writer::w_chunk<unsigned_int>(w,0x905,&this->m_flags);
  return;
}

Assistant:

void xr_visual_object::save(xr_writer& w) const
{
	xr_custom_object::save(w);
	w.w_chunk<uint16_t>(SCENEOBJ_CHUNK_VERSION, SCENEOBJ_VERSION);
	w.open_chunk(SCENEOBJ_CHUNK_REFERENCE);
	w.w_u32(m_file_version);
	w.w_u32(0);
	w.w_sz(m_reference);
	w.close_chunk();
	w.w_chunk<uint32_t>(SCENEOBJ_CHUNK_FLAGS, m_flags);
}